

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulation.c
# Opt level: O2

void WaterStep(Gamefield *gamefield,IntVec2 coords)

{
  uint uVar1;
  uint uVar2;
  _Bool _Var3;
  uint uVar4;
  uint uVar5;
  IntVec2 local_28;
  IntVec2 local_20;
  
  uVar5 = coords.x;
  uVar2 = coords.y;
  local_28.y = uVar2 + 1;
  local_20 = coords;
  if ((((-1 < (int)(local_28.y | uVar5)) && (uVar5 < gamefield->width)) &&
      ((uint)local_28.y < gamefield->height)) &&
     (local_28.x = uVar5, _Var3 = CheckDensity(gamefield,&local_20,&local_28), _Var3)) {
    return;
  }
  local_28.y = uVar2 - 1;
  if ((((int)(local_28.y | uVar5) < 0) || (gamefield->width <= uVar5)) ||
     ((gamefield->height <= (uint)local_28.y ||
      (local_28.x = uVar5,
      gamefield->pixels[gamefield->width * local_28.y + uVar5].pixelType != Empty)))) {
    uVar4 = uVar5 - 1;
    if ((-1 < (int)(local_28.y | uVar4)) && (uVar1 = gamefield->width, uVar4 < uVar1)) {
      if ((uint)local_28.y < gamefield->height) {
        if (((gamefield->pixels[uVar1 * local_28.y + uVar4].pixelType == Empty) &&
            (local_28.x = uVar5 + 1, (uint)local_28.x < uVar1 && -1 < (local_28.y | local_28.x))) &&
           (gamefield->pixels[uVar1 * local_28.y + local_28.x].pixelType == Empty)) {
          if ((gamefield->simulationStep & 1) == 0) {
            local_28.x = uVar4;
          }
          goto LAB_001372ce;
        }
      }
      if (((uint)local_28.y < gamefield->height) &&
         (local_28.x = uVar4, gamefield->pixels[uVar1 * local_28.y + uVar4].pixelType == Empty))
      goto LAB_001372ce;
    }
    uVar5 = uVar5 + 1;
    local_28.x = uVar5;
    if ((((int)(local_28.y | uVar5) < 0) ||
        ((gamefield->width <= uVar5 || (gamefield->height <= (uint)local_28.y)))) ||
       (gamefield->pixels[gamefield->width * local_28.y + uVar5].pixelType != Empty)) {
      local_28.y = uVar2;
      if ((-1 < (int)(uVar4 | uVar2)) && (uVar1 = gamefield->width, uVar4 < uVar1)) {
        if ((uVar2 < gamefield->height) && ((uVar5 < uVar1 && (-1 < (int)(uVar5 | uVar2))))) {
          if ((gamefield->pixels[uVar1 * uVar2 + uVar4].pixelType == Empty) &&
             (gamefield->pixels[uVar1 * uVar2 + uVar5].pixelType == Empty)) {
            if ((gamefield->simulationStep & 1) == 0) {
              local_28.x = uVar4;
            }
            goto LAB_001372ce;
          }
        }
        if ((uVar2 < gamefield->height) &&
           (local_28.x = uVar4, gamefield->pixels[uVar1 * uVar2 + uVar4].pixelType == Empty))
        goto LAB_001372ce;
      }
      if ((int)(uVar5 | uVar2) < 0) {
        return;
      }
      if (gamefield->width <= uVar5) {
        return;
      }
      if (gamefield->height <= uVar2) {
        return;
      }
      local_28.x = uVar5;
      if (gamefield->pixels[gamefield->width * uVar2 + uVar5].pixelType != Empty) {
        return;
      }
    }
  }
LAB_001372ce:
  SwapWaterPixel(gamefield,&local_20,&local_28);
  return;
}

Assistant:

void WaterStep(Gamefield* gamefield, IntVec2 coords) {
    struct IntVec2 new;
    new.x = coords.x;
    new.y = coords.y + 1;

    if (WithinBounds(gamefield, coords.x, coords.y + 1) && CheckDensity(gamefield, &coords, &new)) {
        return;
    }

    if (WithinBounds(gamefield, coords.x, coords.y - 1) && gamefield->pixels[(coords.y - 1) * gamefield->width + coords.x].pixelType == Empty) {
        new.x = coords.x;
        new.y = coords.y;
        new.y -= 1;
        SwapWaterPixel(gamefield, &coords, &new);
    } else if (WithinBounds(gamefield, coords.x - 1, coords.y - 1) &&
               gamefield->pixels[(coords.y - 1) * gamefield->width + (coords.x - 1)].pixelType == Empty
               && WithinBounds(gamefield, coords.x + 1, coords.y - 1) &&
               gamefield->pixels[(coords.y - 1) * gamefield->width + (coords.x + 1)].pixelType == Empty) {
        new.x = coords.x;
        new.y = coords.y;
        if (gamefield->simulationStep % 2 == 0) {
            new.y -= 1;
            new.x -= 1;
        } else {
            new.y -= 1;
            new.x += 1;
        }
        SwapWaterPixel(gamefield, &coords, &new);
    } else if (WithinBounds(gamefield, coords.x - 1, coords.y - 1) &&
               gamefield->pixels[(coords.y - 1) * gamefield->width + (coords.x - 1)].pixelType == Empty) {
        new.x = coords.x;
        new.y = coords.y;
        new.y -= 1;
        new.x -= 1;
        SwapWaterPixel(gamefield, &coords, &new);
    } else if (WithinBounds(gamefield, coords.x + 1, coords.y - 1) &&
               gamefield->pixels[(coords.y - 1) * gamefield->width + (coords.x + 1)].pixelType == Empty) {
        new.x = coords.x;
        new.y = coords.y;
        new.y -= 1;
        new.x += 1;
        SwapWaterPixel(gamefield, &coords, &new);
    } else if (WithinBounds(gamefield, coords.x - 1, coords.y)
               && gamefield->pixels[coords.y * gamefield->width + (coords.x - 1)].pixelType == Empty
               && WithinBounds(gamefield, coords.x + 1, coords.y)
               && gamefield->pixels[coords.y * gamefield->width + (coords.x + 1)].pixelType == Empty) {
        new.x = coords.x;
        new.y = coords.y;
        if (gamefield->simulationStep % 2 == 0) {
            new.x -= 1;
        } else {
            new.x += 1;
        }
        SwapWaterPixel(gamefield, &coords, &new);
    } else if (WithinBounds(gamefield, coords.x - 1, coords.y)
               && gamefield->pixels[coords.y * gamefield->width + (coords.x - 1)].pixelType == Empty) {
        new.x = coords.x;
        new.y = coords.y;
        new.x -= 1;
        SwapWaterPixel(gamefield, &coords, &new);
    } else if (WithinBounds(gamefield, coords.x + 1, coords.y)
               && gamefield->pixels[coords.y * gamefield->width + (coords.x + 1)].pixelType == Empty) {
        new.x = coords.x;
        new.y = coords.y;
        new.x += 1;
        SwapWaterPixel(gamefield, &coords, &new);
    }
}